

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<Js::PropertyRecord_const*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key,PropertyRecord **value)

{
  Type *pTVar1;
  char *addr;
  hash_t hashCode;
  uint uVar2;
  PropertyRecord *pPVar3;
  SimpleHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  *pSVar4;
  int *piVar5;
  SimpleHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
  *pSVar6;
  code *pcVar7;
  char cVar8;
  WriteBarrierPtr<const_Js::PropertyRecord> WVar9;
  PropertyRecord **ppPVar10;
  BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar11;
  bool bVar12;
  int iVar13;
  undefined4 *puVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  WriteBarrierPtr<const_Js::PropertyRecord> local_70;
  PropertyRecord **local_68;
  PropertyRecord **local_60;
  ulong local_58;
  BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_50;
  long local_48;
  PropertyRecord *local_40;
  uint local_34;
  
  lVar18 = *(long *)this;
  local_68 = value;
  local_60 = key;
  if (lVar18 == 0) {
    BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar18 = *(long *)this;
  }
  hashCode = (*local_60)->pid * 2 + 1;
  local_34 = BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar16 = *(uint *)(lVar18 + (ulong)local_34 * 4);
  local_50 = (BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *)this;
  if ((int)uVar16 < 0) {
    cVar8 = (char)(uVar16 >> 0x18);
    uVar17 = 0;
  }
  else {
    local_48 = CONCAT44(local_48._4_4_,hashCode);
    local_58 = *(ulong *)(this + 8);
    uVar17 = 0;
    do {
      addr = (char *)(local_58 + (ulong)uVar16 * 0x10);
      pPVar3 = *(PropertyRecord **)(local_58 + (ulong)uVar16 * 0x10);
      Memory::Recycler::WBSetBit((char *)&local_40);
      ppPVar10 = local_60;
      local_40 = pPVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
      if (local_40 == *ppPVar10) {
        if (local_50->stats != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(local_50->stats,uVar17);
        }
        pPVar3 = *local_68;
        Memory::Recycler::WBSetBit((char *)&local_40);
        local_40 = pPVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
        pPVar3 = local_40;
        Memory::Recycler::WBSetBit(addr);
        *(PropertyRecord **)addr = pPVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
        return uVar16;
      }
      uVar17 = uVar17 + 1;
      uVar16 = *(uint *)(addr + 8);
    } while (-1 < (int)uVar16);
    cVar8 = (char)(uVar16 >> 0x18);
    hashCode = (hash_t)local_48;
  }
  pBVar11 = local_50;
  if (local_50->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_50->stats,uVar17);
  }
  if (cVar8 < '\0') {
    if (pBVar11->freeCount == 0) {
      uVar16 = pBVar11->count;
      if (uVar16 == pBVar11->size) {
        BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Resize(pBVar11);
        local_34 = BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::GetBucket(hashCode,pBVar11->bucketCount,pBVar11->modFunctionIndex);
        uVar16 = pBVar11->count;
      }
      uVar15 = (ulong)uVar16;
      pBVar11->count = uVar16 + 1;
      if (pBVar11->size < (int)(uVar16 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3f1,"(count <= size)","count <= size");
        if (!bVar12) goto LAB_007874d0;
        *puVar14 = 0;
      }
      if (pBVar11->size <= (int)uVar16) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3f2,"(index < size)","index < size");
        if (!bVar12) goto LAB_007874d0;
        *puVar14 = 0;
      }
    }
    else {
      if (pBVar11->freeCount < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar12) goto LAB_007874d0;
        *puVar14 = 0;
      }
      if (pBVar11->freeList < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar12) goto LAB_007874d0;
        *puVar14 = 0;
      }
      if (pBVar11->count <= pBVar11->freeList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                            ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar12) {
LAB_007874d0:
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        *puVar14 = 0;
      }
      uVar15 = (ulong)(uint)pBVar11->freeList;
      pTVar1 = &pBVar11->freeCount;
      *pTVar1 = *pTVar1 + -1;
      if (*pTVar1 != 0) {
        iVar13 = BaseDictionary<const_Js::PropertyRecord_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::GetNextFreeEntryIndex((pBVar11->entries).ptr + pBVar11->freeList);
        pBVar11->freeList = iVar13;
      }
    }
    pSVar4 = (pBVar11->entries).ptr;
    lVar18 = (long)(int)uVar15;
    pSVar6 = pSVar4 + lVar18;
    pPVar3 = *local_60;
    local_58 = uVar15;
    local_48 = lVar18;
    Memory::Recycler::WBSetBit((char *)&local_40);
    local_40 = pPVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_40);
    pPVar3 = *local_68;
    Memory::Recycler::WBSetBit((char *)&local_70);
    local_70.ptr = pPVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_70);
    WVar9.ptr = local_70.ptr;
    Memory::Recycler::WBSetBit((char *)pSVar6);
    pBVar11 = local_50;
    uVar15 = local_58;
    pSVar4[lVar18].
    super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .
    super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
    .super_ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>.value.ptr = WVar9.ptr;
    uVar16 = (uint)local_58;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar6);
    piVar5 = (pBVar11->buckets).ptr;
    pSVar6 = (pBVar11->entries).ptr;
    pSVar6[lVar18].
    super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
    .
    super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
    .
    super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
    .super_ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>.next =
         piVar5[local_34];
    piVar5[local_34] = (int)local_48;
    uVar17 = 0;
    uVar15 = uVar15 & 0xffffffff;
    do {
      uVar2 = pSVar6[(int)uVar15].
              super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
              .
              super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>
              .
              super_ValueEntry<Memory::WriteBarrierPtr<const_Js::PropertyRecord>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>_>
              .super_ValueEntryData<Memory::WriteBarrierPtr<const_Js::PropertyRecord>_>.next;
      uVar15 = (ulong)uVar2;
      uVar17 = uVar17 + 1;
    } while (uVar2 != 0xffffffff);
    if (pBVar11->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(pBVar11->stats,uVar17);
    }
  }
  return uVar16;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }